

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O0

int JetHead::stl_sprintf<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,char *format,
              ...)

{
  char in_AL;
  int iVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined4 local_38;
  int size;
  va_list params;
  char *format_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  size = 0x30;
  local_38 = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  params[0]._0_8_ = &stack0x00000008;
  params[0].overflow_arg_area = local_f8;
  local_3c = vsnprintf((char *)0x0,0,format,&local_38);
  std::__cxx11::string::resize((ulong)str);
  size = 0x30;
  local_38 = 0x10;
  params[0]._0_8_ = &stack0x00000008;
  params[0].overflow_arg_area = local_f8;
  __s = (char *)std::__cxx11::string::c_str();
  iVar1 = vsprintf(__s,format,&local_38);
  return iVar1;
}

Assistant:

int		stl_sprintf( _string &str, const char *format, ... )
	{
		va_list params;
		va_start( params, format );
		int size = ::vsnprintf( NULL, 0, format, params );
		va_end( params );
		str.resize( size );
		va_start( params, format );
		return ::vsprintf( (char*)str.c_str(), format, params );		
		va_end( params );
	}